

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
 __thiscall Storage::Tape::MSX::Parser::find_header(Parser *this,BinaryTapePlayer *tape_player)

{
  undefined1 *puVar1;
  __uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
  _Var2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  IntType IVar6;
  IntType IVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  Source SVar12;
  float fVar13;
  float local_70;
  _func_int **local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  float local_54;
  __uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
  local_50;
  Source local_48;
  
  bVar3 = BinaryTapePlayer::get_motor_control(tape_player);
  if (bVar3) {
    local_50._M_t.
    super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
    .super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>._M_head_impl =
         (tuple<Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
          )(tuple<Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
            )this;
    bVar3 = BinaryTapePlayer::get_input(tape_player);
    fVar13 = 1.1754944e-38;
    SVar12._0_12_ = ZEXT812(0x7f7fffff);
    SVar12.observer_._4_4_ = 0;
    iVar8 = 0;
    do {
      local_54 = fVar13;
      local_48 = SVar12;
      TapePlayer::get_tape((TapePlayer *)&local_68);
      cVar4 = (**(code **)*local_68)();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      if (cVar4 != '\0') break;
      local_70 = 0.0;
      do {
        IVar6 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)tape_player);
        IVar7 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)tape_player);
        local_70 = local_70 + (float)IVar6 / (float)IVar7;
        TapePlayer::run_for_input_pulse(&tape_player->super_TapePlayer);
        bVar5 = BinaryTapePlayer::get_input(tape_player);
      } while (bVar3 == bVar5);
      bVar3 = BinaryTapePlayer::get_input(tape_player);
      fVar10 = local_70;
      if (local_48._vptr_Source._0_4_ <= local_70) {
        fVar10 = local_48._vptr_Source._0_4_;
      }
      if (local_70 <= local_54) {
        local_70 = local_54;
      }
      iVar8 = iVar8 + 1;
      fVar11 = local_70 - fVar10;
      fVar13 = 1.1754944e-38;
      if (fVar11 <= 3.5e-05) {
        fVar13 = local_70;
      }
      SVar12 = (Source)ZEXT416(~-(uint)(3.5e-05 < fVar11) & (uint)fVar10 |
                               -(uint)(3.5e-05 < fVar11) & 0x7f7fffff);
      if (3.5e-05 < fVar11) {
        iVar8 = 0;
      }
    } while (iVar8 != 0x8ae);
    TapePlayer::get_tape((TapePlayer *)&local_68);
    cVar4 = (**(code **)*local_68)();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    this = (Parser *)local_50;
    if (cVar4 == '\0') {
      iVar8 = 0x200;
      local_70 = 0.0;
      while( true ) {
        TapePlayer::get_tape((TapePlayer *)&local_68);
        cVar4 = (**(code **)*local_68)();
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
        if (cVar4 != '\0') break;
        IVar6 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)tape_player);
        IVar7 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)tape_player);
        local_70 = local_70 + (float)IVar6 / (float)IVar7;
        bVar5 = BinaryTapePlayer::get_input(tape_player);
        if (bVar5 != bVar3) {
          iVar8 = iVar8 + -1;
          if (iVar8 == 0) break;
          bVar3 = BinaryTapePlayer::get_input(tape_player);
        }
        TapePlayer::run_for_input_pulse(&tape_player->super_TapePlayer);
      }
      TapePlayer::get_tape((TapePlayer *)&local_68);
      cVar4 = (**(code **)*local_68)();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      _Var2._M_t.
      super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
      .super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>._M_head_impl =
           local_50._M_t.
           super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
           .super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>._M_head_impl;
      this = (Parser *)
             local_50._M_t.
             super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
             .super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>._M_head_impl;
      if (cVar4 == '\0') {
        uVar9 = (uint)((local_70 * 0.00390625) / 8.5875e-06);
        std::make_unique<Storage::Tape::MSX::Parser::FileSpeed>();
        puVar1 = *(undefined1 **)
                  _Var2._M_t.
                  super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                  .super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>.
                  _M_head_impl;
        *puVar1 = (char)uVar9;
        puVar1[1] = (char)((uVar9 & 0xff) * 3 >> 2);
        return (__uniq_ptr_data<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,_true,_true>
                )(__uniq_ptr_data<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,_true,_true>
                  )_Var2._M_t.
                   super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                   .super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>.
                   _M_head_impl;
      }
    }
  }
  *(long *)this = 0;
  return (__uniq_ptr_data<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,_true,_true>
          )(tuple<Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
            )this;
}

Assistant:

std::unique_ptr<Parser::FileSpeed> Parser::find_header(Storage::Tape::BinaryTapePlayer &tape_player) {
	if(!tape_player.get_motor_control()) {
		return nullptr;
	}

	/*
		"When 1,111 cycles have been found with less than 35 microseconds
		variation in their lengths a header has been located."
	*/
	bool last_level = tape_player.get_input();
	float low = std::numeric_limits<float>::max();
	float high = std::numeric_limits<float>::min();
	int samples = 0;
	while(!tape_player.get_tape()->is_at_end()) {
		float next_length = 0.0f;
		do {
			next_length += float(tape_player.get_cycles_until_next_event()) / float(tape_player.get_input_clock_rate());
			tape_player.run_for_input_pulse();
		} while(last_level == tape_player.get_input());
		last_level = tape_player.get_input();
		low = std::min(low, next_length);
		high = std::max(high, next_length);
		samples++;
		if(high - low > 0.000035f) {
			low = std::numeric_limits<float>::max();
			high = std::numeric_limits<float>::min();
			samples = 0;
		}
		if(samples == 1111*2) break;	// Cycles are read, not half-cycles.
	}

	if(tape_player.get_tape()->is_at_end()) return nullptr;

	/*
		"The next 256 cycles are then read (1B34H) and averaged to determine the cassette HI cycle length."
	*/
	float total_length = 0.0f;
	samples = 512;
	while(!tape_player.get_tape()->is_at_end()) {
		total_length += float(tape_player.get_cycles_until_next_event()) / float(tape_player.get_input_clock_rate());
		if(tape_player.get_input() != last_level) {
			samples--;
			if(!samples) break;
			last_level = tape_player.get_input();
		}
		tape_player.run_for_input_pulse();
	}

	if(tape_player.get_tape()->is_at_end()) return nullptr;

	/*
		This figure is multiplied by 1.5 and placed in LOWLIM where it defines the minimum acceptable length
		of a 0 start bit. The HI cycle length is placed in WINWID and will be used to discriminate
		between LO and HI cycles."
	*/
	total_length = total_length / 256.0f;			// To get the average, in microseconds.
	// To convert to the loop count format used by the MSX BIOS.
	uint8_t int_result = uint8_t(total_length / (0.00001145f * 0.75f));

	auto result = std::make_unique<FileSpeed>();
	result->minimum_start_bit_duration = int_result;
	result->low_high_disrimination_duration = (int_result * 3) >> 2;

	return result;
}